

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvnc.cpp
# Opt level: O1

void __thiscall
QVncClientCursor::changeCursor(QVncClientCursor *this,QCursor *widgetCursor,QWindow *window)

{
  long lVar1;
  QVncClient **ppQVar2;
  QVncClient *this_00;
  undefined8 uVar3;
  int iVar4;
  QPoint QVar5;
  long lVar6;
  long in_FS_OFFSET;
  code *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  QPoint QStack_70;
  QPixmap local_60 [24];
  QImage local_48 [16];
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (widgetCursor == (QCursor *)0x0) {
    iVar4 = 0;
  }
  else {
    iVar4 = QCursor::shape();
  }
  if (iVar4 == 0x18) {
    QVar5 = (QPoint)QCursor::hotSpot();
    this->hotspot = QVar5;
    QCursor::pixmap();
    QPixmap::toImage();
    local_78 = 0xaaaaaaaaaaaaaaaa;
    local_88 = (code *)0xaaaaaaaaaaaaaaaa;
    uStack_80 = 0xaaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)&local_88);
    uVar3 = local_38;
    local_88 = QTextStream::operator<<;
    local_38 = 0;
    local_78 = *(undefined8 *)&this->field_0x20;
    *(undefined8 *)&this->field_0x20 = uVar3;
    QImage::~QImage((QImage *)&local_88);
    QImage::~QImage(local_48);
    QPixmap::~QPixmap(local_60);
  }
  else {
    local_78 = 0xaaaaaaaaaaaaaaaa;
    QStack_70.xp.m_i = -0x55555556;
    QStack_70.yp.m_i = -0x55555556;
    local_88 = (code *)0xaaaaaaaaaaaaaaaa;
    uStack_80 = 0xaaaaaaaaaaaaaaaa;
    QImage::QImage((QImage *)&local_88);
    QStack_70.xp.m_i = 0;
    QStack_70.yp.m_i = 0;
    QPlatformCursorImage::set((uchar *)&local_88,(uchar *)0x0,0,0,0,0);
    QPlatformCursorImage::set((CursorShape)(QImage *)&local_88);
    QImage::operator=(&this->cursor,(QImage *)&local_88);
    this->hotspot = QStack_70;
    QImage::~QImage((QImage *)&local_88);
  }
  lVar1 = (this->clients).d.size;
  if (lVar1 != 0) {
    ppQVar2 = (this->clients).d.ptr;
    lVar6 = 0;
    do {
      this_00 = *(QVncClient **)((long)ppQVar2 + lVar6);
      this_00[0x68] = (QVncClient)0x1;
      QVncClient::scheduleUpdate(this_00);
      lVar6 = lVar6 + 8;
    } while (lVar1 << 3 != lVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QVncClientCursor::changeCursor(QCursor *widgetCursor, QWindow *window)
{
    Q_UNUSED(window);
    const Qt::CursorShape shape = widgetCursor ? widgetCursor->shape() : Qt::ArrowCursor;

    if (shape == Qt::BitmapCursor) {
        // application supplied cursor
        hotspot = widgetCursor->hotSpot();
        cursor = widgetCursor->pixmap().toImage();
    } else {
        // system cursor
        QPlatformCursorImage platformImage(nullptr, nullptr, 0, 0, 0, 0);
        platformImage.set(shape);
        cursor = *platformImage.image();
        hotspot = platformImage.hotspot();
    }
    for (auto client : std::as_const(clients))
        client->setDirtyCursor();
}